

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_setup_all1(APITests *this)

{
  pointer piVar1;
  bool bVar2;
  pointer piVar3;
  int pin;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  GPIO::setmode(BOARD);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_48,
             (long)(this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar1 = (this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar3 = (this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    pin = *piVar3;
    bVar2 = is_in<int&,std::vector<int,std::allocator<int>>&>
                      (&pin,&(this->pin_data).unimplemented_pins);
    if (!bVar2) {
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)&local_48,&pin);
    }
  }
  GPIO::setup((vector *)&local_48,IN,-1);
  GPIO::cleanup();
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void test_setup_all1()
    {
        GPIO::setmode(GPIO::BOARD);
        std::vector<int> pins{};
        pins.reserve(all_board_pins.size());

        for (auto pin : all_board_pins)
        {
            if (is_in(pin, pin_data.unimplemented_pins))
                continue;

            pins.emplace_back(pin);
        }

        GPIO::setup(pins, GPIO::IN);
        GPIO::cleanup();
    }